

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O1

bool caffe::NetNeedsBatchNormUpgrade(NetParameter *net_param)

{
  int iVar1;
  Type *pTVar2;
  bool bVar3;
  int iVar4;
  
  iVar4 = (net_param->layer_).super_RepeatedPtrFieldBase.current_size_;
  bVar3 = 0 < iVar4;
  if (0 < iVar4) {
    iVar4 = 0;
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&(net_param->layer_).super_RepeatedPtrFieldBase,iVar4);
      iVar1 = std::__cxx11::string::compare((char *)(pTVar2->type_).ptr_);
      if ((iVar1 == 0) &&
         (pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                             (&(net_param->layer_).super_RepeatedPtrFieldBase,iVar4),
         (pTVar2->param_).super_RepeatedPtrFieldBase.current_size_ == 3)) {
        return bVar3;
      }
      iVar4 = iVar4 + 1;
      iVar1 = (net_param->layer_).super_RepeatedPtrFieldBase.current_size_;
      bVar3 = iVar4 < iVar1;
    } while (iVar4 < iVar1);
  }
  return bVar3;
}

Assistant:

bool NetNeedsBatchNormUpgrade(const NetParameter& net_param) {
  for (int i = 0; i < net_param.layer_size(); ++i) {
    // Check if BatchNorm layers declare three parameters, as required by
    // the previous BatchNorm layer definition.
    if (net_param.layer(i).type() == "BatchNorm"
        && net_param.layer(i).param_size() == 3) {
      return true;
    }
  }
  return false;
}